

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.cpp
# Opt level: O2

ICpuInfo * xmrig::Cpu::info(void)

{
  HwlocCpuInfo *this;
  
  if (cpuInfo == (ICpuInfo *)0x0) {
    this = (HwlocCpuInfo *)operator_new(0xd8);
    HwlocCpuInfo::HwlocCpuInfo(this);
    cpuInfo = (ICpuInfo *)this;
  }
  return cpuInfo;
}

Assistant:

xmrig::ICpuInfo *xmrig::Cpu::info()
{
    if (cpuInfo == nullptr) {
#       if defined(XMRIG_FEATURE_HWLOC)
        cpuInfo = new HwlocCpuInfo();
#       elif defined(XMRIG_FEATURE_LIBCPUID)
        cpuInfo = new AdvancedCpuInfo();
#       else
        cpuInfo = new BasicCpuInfo();
#       endif
    }

    return cpuInfo;
}